

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_text.cpp
# Opt level: O2

bool text_has_been_edited(Am_Object *inter,Am_Object *text)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_String new_text;
  Am_String orig_text;
  Am_String local_18;
  Am_String local_10;
  
  local_10.data = (Am_String_Data *)0x0;
  local_18.data = (Am_String_Data *)0x0;
  pAVar2 = Am_Object::Get(inter,0x16c,0);
  Am_String::operator=(&local_10,pAVar2);
  pAVar2 = Am_Object::Get(text,0xab,0);
  Am_String::operator=(&local_18,pAVar2);
  bVar1 = Am_String::operator==(&local_10,&local_18);
  Am_String::~Am_String(&local_18);
  Am_String::~Am_String(&local_10);
  return !bVar1;
}

Assistant:

bool
text_has_been_edited(Am_Object inter, Am_Object text)
{
  Am_String orig_text, new_text;
  orig_text = inter.Get(Am_OLD_VALUE);
  new_text = text.Get(Am_TEXT);
  return !(orig_text == new_text);
}